

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseArithmeticExpression(Parser *this)

{
  function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *in_RSI;
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x18);
  *(code **)local_38._M_unused._0_8_ = parseAddExpression;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = 0;
  *(function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> **)
   ((long)local_38._M_unused._0_8_ + 0x10) = in_RSI;
  pcStack_20 = std::
               _Function_handler<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(),_std::_Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>_>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(),_std::_Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>_>
             ::_M_manager;
  uStack_50 = 0;
  local_58 = Token::isBinaryOperator;
  pcStack_40 = std::_Function_handler<bool_(const_Token_&),_bool_(*)(const_Token_&)>::_M_invoke;
  local_48 = std::_Function_handler<bool_(const_Token_&),_bool_(*)(const_Token_&)>::_M_manager;
  parseExpression(this,in_RSI,(function<bool_(const_Token_&)> *)&local_38);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseArithmeticExpression()
{
  return parseExpression(std::bind(&Parser::parseAddExpression, this), Token::isBinaryOperator);
}